

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O1

void chip_generate(opl_chip *chip,Bit16s *buff)

{
  opl_slot *poVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  Bit16s BVar6;
  Bit8u BVar7;
  Bit16s **ppBVar8;
  undefined2 uVar9;
  int iVar10;
  ushort uVar11;
  Bit8u jj;
  long lVar12;
  long lVar13;
  
  iVar10 = -0x8000;
  if (-0x8000 < chip->mixbuff[1]) {
    iVar10 = chip->mixbuff[1];
  }
  BVar6 = (Bit16s)iVar10;
  if (0x7ffe < iVar10) {
    BVar6 = 0x7fff;
  }
  buff[1] = BVar6;
  lVar13 = 0x630;
  do {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar13);
    sVar3 = *(short *)((long)chip->channel[0].out + lVar13);
    *(short *)((long)chip->channel[0].out + lVar13 + 2) = sVar3;
    sVar4 = *(short *)((long)chip->channel[0].slots + lVar13 + 0x10);
    *(short *)((long)chip->channel[0].out + lVar13) = sVar4;
    cVar2 = *(char *)(*(long *)((long)chip->channel[0].slots + lVar13) + 0x45);
    uVar9 = (undefined2)((int)sVar4 + (int)sVar3 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar9 = 0;
    }
    *(undefined2 *)((long)chip->channel[0].out + lVar13 + -0xe) = uVar9;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    BVar6 = (*envelope_sin[*(byte *)((long)chip->channel[0].out + lVar13 + 0x22)])
                      ((short)(*(uint *)((long)chip->channel[0].out + lVar13 + 0x24) >> 9) +
                       **(short **)((long)chip->channel[0].out + lVar13 + -8),
                       *(Bit16u *)((long)chip->channel[0].out + lVar13 + 6));
    *(Bit16s *)((long)chip->channel[0].slots + lVar13 + 0x10) = BVar6;
    lVar13 = lVar13 + 0x48;
  } while (lVar13 != 0x990);
  lVar13 = 0x990;
  do {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar13);
    sVar3 = *(short *)((long)chip->channel[0].out + lVar13);
    *(short *)((long)chip->channel[0].out + lVar13 + 2) = sVar3;
    sVar4 = *(short *)((long)chip->channel[0].slots + lVar13 + 0x10);
    *(short *)((long)chip->channel[0].out + lVar13) = sVar4;
    cVar2 = *(char *)(*(long *)((long)chip->channel[0].slots + lVar13) + 0x45);
    uVar9 = (undefined2)((int)sVar4 + (int)sVar3 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar9 = 0;
    }
    *(undefined2 *)((long)chip->channel[0].out + lVar13 + -0xe) = uVar9;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    lVar13 = lVar13 + 0x48;
  } while (lVar13 != 0xa68);
  if ((chip->rhy & 0x20) == 0) {
    BVar6 = (*envelope_sin[chip->slot[0xc].reg_wf])
                      ((short)(chip->slot[0xc].pg_phase >> 9) + *chip->slot[0xc].mod,
                       chip->slot[0xc].eg_out);
    chip->slot[0xc].out = BVar6;
    BVar6 = (*envelope_sin[chip->slot[0xd].reg_wf])
                      ((short)(chip->slot[0xd].pg_phase >> 9) + *chip->slot[0xd].mod,
                       chip->slot[0xd].eg_out);
    chip->slot[0xd].out = BVar6;
    BVar6 = (*envelope_sin[chip->slot[0xe].reg_wf])
                      ((short)(chip->slot[0xe].pg_phase >> 9) + *chip->slot[0xe].mod,
                       chip->slot[0xe].eg_out);
    chip->slot[0xe].out = BVar6;
  }
  else {
    chan_generaterhythm1(chip);
  }
  chip->mixbuff[0] = 0;
  ppBVar8 = chip->channel[0].out;
  lVar13 = 0;
  iVar10 = 0;
  do {
    lVar12 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + *ppBVar8[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    if (chip->FullPan == '\0') {
      uVar11 = uVar11 & chip->channel[lVar13].cha;
    }
    else {
      uVar11 = (ushort)(int)((float)(int)(short)uVar11 * chip->channel[lVar13].fcha);
    }
    iVar10 = iVar10 + (short)uVar11;
    lVar13 = lVar13 + 1;
    ppBVar8 = ppBVar8 + 0xb;
  } while (lVar13 != 0x12);
  chip->mixbuff[0] = iVar10;
  lVar13 = 0xa68;
  do {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar13);
    sVar3 = *(short *)((long)chip->channel[0].out + lVar13);
    *(short *)((long)chip->channel[0].out + lVar13 + 2) = sVar3;
    sVar4 = *(short *)((long)chip->channel[0].slots + lVar13 + 0x10);
    *(short *)((long)chip->channel[0].out + lVar13) = sVar4;
    cVar2 = *(char *)(*(long *)((long)chip->channel[0].slots + lVar13) + 0x45);
    uVar9 = (undefined2)((int)sVar4 + (int)sVar3 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar9 = 0;
    }
    *(undefined2 *)((long)chip->channel[0].out + lVar13 + -0xe) = uVar9;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    lVar13 = lVar13 + 0x48;
  } while (lVar13 != 0xb40);
  if ((chip->rhy & 0x20) == 0) {
    BVar6 = (*envelope_sin[chip->slot[0xf].reg_wf])
                      ((short)(chip->slot[0xf].pg_phase >> 9) + *chip->slot[0xf].mod,
                       chip->slot[0xf].eg_out);
    chip->slot[0xf].out = BVar6;
    BVar6 = (*envelope_sin[chip->slot[0x10].reg_wf])
                      ((short)(chip->slot[0x10].pg_phase >> 9) + *chip->slot[0x10].mod,
                       chip->slot[0x10].eg_out);
    chip->slot[0x10].out = BVar6;
    BVar6 = (*envelope_sin[chip->slot[0x11].reg_wf])
                      ((short)(chip->slot[0x11].pg_phase >> 9) + *chip->slot[0x11].mod,
                       chip->slot[0x11].eg_out);
    chip->slot[0x11].out = BVar6;
  }
  else {
    chan_generaterhythm2(chip);
  }
  iVar10 = -0x8000;
  if (-0x8000 < chip->mixbuff[0]) {
    iVar10 = chip->mixbuff[0];
  }
  BVar6 = (Bit16s)iVar10;
  if (0x7ffe < iVar10) {
    BVar6 = 0x7fff;
  }
  *buff = BVar6;
  lVar13 = 0;
  do {
    poVar1 = (opl_slot *)((long)chip->slot[0x12].prout + lVar13 + -0x20);
    sVar3 = *(short *)((long)chip->slot[0x12].prout + lVar13);
    *(short *)((long)chip->slot[0x12].prout + lVar13 + 2) = sVar3;
    sVar4 = *(short *)((long)chip->slot[0x12].prout + lVar13 + -0x10);
    *(short *)((long)chip->slot[0x12].prout + lVar13) = sVar4;
    cVar2 = *(char *)(*(long *)((long)chip->slot[0x12].prout + lVar13 + -0x20) + 0x45);
    uVar9 = (undefined2)((int)sVar4 + (int)sVar3 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar9 = 0;
    }
    *(undefined2 *)((long)chip->slot[0x12].prout + lVar13 + -0xe) = uVar9;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    BVar6 = (*envelope_sin[*(byte *)((long)chip->slot[0x12].prout + lVar13 + 0x22)])
                      ((short)(*(uint *)((long)chip->slot[0x12].prout + lVar13 + 0x24) >> 9) +
                       **(short **)((long)chip->slot[0x12].prout + lVar13 + -8),
                       *(Bit16u *)((long)chip->slot[0x12].prout + lVar13 + 6));
    *(Bit16s *)((long)chip->slot[0x12].prout + lVar13 + -0x10) = BVar6;
    lVar13 = lVar13 + 0x48;
  } while (lVar13 != 0x438);
  chip->mixbuff[1] = 0;
  ppBVar8 = chip->channel[0].out;
  lVar13 = 0;
  iVar10 = 0;
  do {
    lVar12 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + *ppBVar8[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    if (chip->FullPan == '\0') {
      uVar11 = uVar11 & chip->channel[lVar13].chb;
    }
    else {
      uVar11 = (ushort)(int)((float)(int)(short)uVar11 * chip->channel[lVar13].fchb);
    }
    iVar10 = iVar10 + (short)uVar11;
    lVar13 = lVar13 + 1;
    ppBVar8 = ppBVar8 + 0xb;
  } while (lVar13 != 0x12);
  chip->mixbuff[1] = iVar10;
  lVar13 = 0;
  do {
    poVar1 = (opl_slot *)((long)chip->slot[0x21].prout + lVar13 + -0x20);
    sVar3 = *(short *)((long)chip->slot[0x21].prout + lVar13);
    *(short *)((long)chip->slot[0x21].prout + lVar13 + 2) = sVar3;
    sVar4 = *(short *)((long)chip->slot[0x21].prout + lVar13 + -0x10);
    *(short *)((long)chip->slot[0x21].prout + lVar13) = sVar4;
    cVar2 = *(char *)(*(long *)((long)chip->slot[0x21].prout + lVar13 + -0x20) + 0x45);
    uVar9 = (undefined2)((int)sVar4 + (int)sVar3 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar9 = 0;
    }
    *(undefined2 *)((long)chip->slot[0x21].prout + lVar13 + -0xe) = uVar9;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    BVar6 = (*envelope_sin[*(byte *)((long)chip->slot[0x21].prout + lVar13 + 0x22)])
                      ((short)(*(uint *)((long)chip->slot[0x21].prout + lVar13 + 0x24) >> 9) +
                       **(short **)((long)chip->slot[0x21].prout + lVar13 + -8),
                       *(Bit16u *)((long)chip->slot[0x21].prout + lVar13 + 6));
    *(Bit16s *)((long)chip->slot[0x21].prout + lVar13 + -0x10) = BVar6;
    lVar13 = lVar13 + 0x48;
  } while (lVar13 != 0xd8);
  if ((chip->noise & 1) != 0) {
    chip->noise = chip->noise ^ 0x800302;
  }
  chip->noise = chip->noise >> 1;
  uVar5._0_2_ = chip->timer;
  uVar5._2_1_ = chip->newm;
  uVar5._3_1_ = chip->nts;
  if ((~uVar5 & 0x3f) != 0) goto LAB_003232ed;
  BVar7 = chip->tremtval;
  if (chip->tremdir == '\0') {
    if (BVar7 != 'i') {
      BVar7 = BVar7 + '\x01';
      goto LAB_003232c6;
    }
    chip->tremtval = 'h';
    chip->tremdir = '\x01';
  }
  else if (BVar7 == '\0') {
    chip->tremtval = '\x01';
    chip->tremdir = '\0';
  }
  else {
    BVar7 = BVar7 + 0xff;
LAB_003232c6:
    chip->tremtval = BVar7;
  }
  chip->tremval = (chip->tremtval >> 2) >> (chip->dam * -2 + 2 & 0x1f);
LAB_003232ed:
  chip->timer = (undefined2)uVar5 + 1;
  return;
}

Assistant:

void chip_generate(opl_chip *chip, Bit16s *buff) {
	buff[1] = limshort(chip->mixbuff[1]);

	for (Bit8u ii = 0; ii < 12; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	for (Bit8u ii = 12; ii < 15; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm1(chip);
	}
	else {
		slot_generate(&chip->slot[12]);
		slot_generate(&chip->slot[13]);
		slot_generate(&chip->slot[14]);
	}

	chip->mixbuff[0] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[0] += (Bit16s)(accm * chip->channel[ii].fcha);
		}
		else {
			chip->mixbuff[0] += (Bit16s)(accm & chip->channel[ii].cha);
		}
	}

	for (Bit8u ii = 15; ii < 18; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm2(chip);
	}
	else {
		slot_generate(&chip->slot[15]);
		slot_generate(&chip->slot[16]);
		slot_generate(&chip->slot[17]);
	}

	buff[0] = limshort(chip->mixbuff[0]);

	for (Bit8u ii = 18; ii < 33; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	chip->mixbuff[1] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[1] += (Bit16s)(accm * chip->channel[ii].fchb);
		}
		else {
			chip->mixbuff[1] += (Bit16s)(accm & chip->channel[ii].chb);
		}
	}

	for (Bit8u ii = 33; ii < 36; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	n_generate(chip);

	if ((chip->timer & 0x3f) == 0x3f) {
		if (!chip->tremdir) {
			if (chip->tremtval == 105) {
				chip->tremtval--;
				chip->tremdir = 1;
			}
			else {
				chip->tremtval++;
			}
		}
		else {
			if (chip->tremtval == 0) {
				chip->tremtval++;
				chip->tremdir = 0;
			}
			else {
				chip->tremtval--;
			}
		}
		chip->tremval = (chip->tremtval >> 2) >> ((1 - chip->dam) << 1);
	}

	chip->timer++;
}